

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> * __thiscall
ggml_backend_cpu_get_extra_buffers_type::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this)

{
  ggml_backend_buffer_type_t pgVar1;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *in_RDI;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *bufts;
  ggml_backend_buffer_type_t in_stack_ffffffffffffffa8;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *this_00;
  
  this_00 = in_RDI;
  std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::vector
            ((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
             0x118635);
  pgVar1 = ggml_backend_cpu_aarch64_buffer_type();
  if (pgVar1 != (ggml_backend_buffer_type_t)0x0) {
    in_stack_ffffffffffffffa8 = ggml_backend_cpu_aarch64_buffer_type();
    std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::push_back
              (this_00,(value_type *)in_stack_ffffffffffffffa8);
  }
  std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::push_back
            (this_00,(value_type *)in_stack_ffffffffffffffa8);
  return in_RDI;
}

Assistant:

std::vector<ggml_backend_buffer_type_t>& ggml_backend_cpu_get_extra_buffers_type() {
    static std::vector<ggml_backend_buffer_type_t> bufts = []() {
        std::vector<ggml_backend_buffer_type_t> bufts;

#if defined(__AMX_INT8__) && defined(__AVX512VNNI__)
        if (ggml_backend_amx_buffer_type()) {
            bufts.push_back(ggml_backend_amx_buffer_type());
        }
#endif

#ifdef GGML_USE_CPU_KLEIDIAI
        if (ggml_backend_cpu_kleidiai_buffer_type()) {
            bufts.push_back(ggml_backend_cpu_kleidiai_buffer_type());
        }
#endif

#ifdef GGML_USE_CPU_AARCH64
        if (ggml_backend_cpu_aarch64_buffer_type()) {
            bufts.push_back(ggml_backend_cpu_aarch64_buffer_type());
        }
#endif

        bufts.push_back(NULL);

        return bufts;
    }();

    return bufts;
}